

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Unate(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  uint local_34;
  uint local_30;
  int fVerbose;
  int fComputeAll;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_30 = 0;
  local_34 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"avh");
      if (iVar1 == -1) {
        bVar3 = pAbc->pGia != (Gia_Man_t *)0x0;
        if (bVar3) {
          Gia_ManCheckUnateTest(pAbc->pGia,local_30,local_34);
        }
        else {
          Abc_Print(-1,"Abc_CommandAbc9Unate(): There is no AIG.\n");
        }
        pAbc_local._4_4_ = (uint)!bVar3;
        return pAbc_local._4_4_;
      }
      if (iVar1 != 0x61) break;
      local_30 = local_30 ^ 1;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) break;
    local_34 = local_34 ^ 1;
  }
  Abc_Print(-2,"usage: &unate [-avh]\n");
  Abc_Print(-2,"\t         prints info about unatements of CO funcs in terms of CI vars\n");
  pcVar2 = "no";
  if (local_30 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-a     : toggle using efficient computation for all pairs [default = %s]\n",pcVar2
           );
  pcVar2 = "no";
  if (local_34 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9Unate( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManCheckUnateTest( Gia_Man_t * p, int fComputeAll, int fVerbose );
    int c, fComputeAll = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "avh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fComputeAll ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Unate(): There is no AIG.\n" );
        return 1;
    }
    Gia_ManCheckUnateTest( pAbc->pGia, fComputeAll, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &unate [-avh]\n" );
    Abc_Print( -2, "\t         prints info about unatements of CO funcs in terms of CI vars\n" );
    Abc_Print( -2, "\t-a     : toggle using efficient computation for all pairs [default = %s]\n", fComputeAll? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}